

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grounder.cpp
# Opt level: O0

bool __thiscall
Kernel::GlobalSubsumptionGrounder::OrderNormalizingComparator::operator()
          (OrderNormalizingComparator *this,uint a,uint b)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Term *pTVar6;
  uint in_EDX;
  uint in_ESI;
  DisagreementSetIterator *in_RDI;
  pair<Kernel::TermList,_Kernel::TermList> da;
  Literal *lb;
  Literal *la;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb0;
  pair<Kernel::TermList,_Kernel::TermList> local_48;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Term *this_00;
  undefined1 disjunctVariables;
  bool local_1;
  
  pTVar6 = (Term *)(in_RDI->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                   _vptr_IteratorCore[in_ESI];
  this_00 = (Term *)(in_RDI->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                    _vptr_IteratorCore[in_EDX];
  if (pTVar6 == this_00) {
    local_1 = false;
  }
  else {
    uVar2 = Term::numVarOccs((Term *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    uVar3 = Term::numVarOccs((Term *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (uVar2 == uVar3) {
      uVar3 = Term::weight(pTVar6);
      uVar4 = Term::weight(this_00);
      if (uVar3 == uVar4) {
        uVar3 = Literal::header((Literal *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        disjunctVariables = (undefined1)((ulong)this_00 >> 0x38);
        uVar4 = Literal::header((Literal *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (uVar3 == uVar4) {
          if (operator()(unsigned_int,unsigned_int)::dsit == '\0') {
            iVar5 = __cxa_guard_acquire(&operator()(unsigned_int,unsigned_int)::dsit);
            if (iVar5 != 0) {
              DisagreementSetIterator::DisagreementSetIterator
                        ((DisagreementSetIterator *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
              __cxa_atexit(DisagreementSetIterator::~DisagreementSetIterator,&operator()::dsit,
                           &__dso_handle);
              __cxa_guard_release(&operator()(unsigned_int,unsigned_int)::dsit);
            }
          }
          DisagreementSetIterator::reset
                    (in_RDI,(Term *)CONCAT44(in_ESI,in_EDX),pTVar6,(bool)disjunctVariables);
          bVar1 = DisagreementSetIterator::hasNext
                            ((DisagreementSetIterator *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          if (!bVar1) {
            __cxa_guard_abort(&operator()(unsigned_int,unsigned_int)::dsit);
            _Unwind_Resume(bVar1);
          }
          local_48 = DisagreementSetIterator::next
                               ((DisagreementSetIterator *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          bVar1 = TermList::isVar((TermList *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          uVar2 = (uint)bVar1;
          bVar1 = TermList::isVar((TermList *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          if (uVar2 == bVar1) {
            bVar1 = TermList::isVar((TermList *)
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            if (bVar1) {
              uVar2 = TermList::var(&local_48.first);
              uVar3 = TermList::var(&local_48.second);
              local_1 = uVar2 < uVar3;
            }
            else {
              pTVar6 = TermList::term((TermList *)0x85dd73);
              uVar2 = Term::functor(pTVar6);
              pTVar6 = TermList::term((TermList *)0x85dd8d);
              uVar3 = Term::functor(pTVar6);
              local_1 = uVar2 < uVar3;
            }
          }
          else {
            local_1 = TermList::isVar((TermList *)
                                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
            ;
          }
        }
        else {
          uVar2 = Literal::header((Literal *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          uVar3 = Literal::header((Literal *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          local_1 = uVar2 < uVar3;
        }
      }
      else {
        uVar2 = Term::weight(pTVar6);
        uVar3 = Term::weight(this_00);
        local_1 = uVar2 < uVar3;
      }
    }
    else {
      uVar2 = Term::numVarOccs((Term *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                              );
      uVar3 = Term::numVarOccs((Term *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                              );
      local_1 = uVar2 < uVar3;
    }
  }
  return local_1;
}

Assistant:

bool operator()(unsigned a, unsigned b) {
    Literal* la = _lits[a];
    Literal* lb = _lits[b];
    if(la==lb) { return false; }
    if(la->numVarOccs()!=lb->numVarOccs()) {
      //first, we want literals with less variables to appear in the
      //beginning as there is better chance to get some sharing across clauses
      return la->numVarOccs()<lb->numVarOccs();
    }
    if(la->weight()!=lb->weight()) {
      return la->weight()<lb->weight();
    }
    if(la->header()!=lb->header()) {
      return la->header()<lb->header();
    }
    //now get just some total deterministic order
    static DisagreementSetIterator dsit;
    dsit.reset(la, lb, false);
    ALWAYS(dsit.hasNext());
    auto da = dsit.next();
    if(da.first.isVar()!=da.second.isVar()) {
      return da.first.isVar();
    }
    if(da.first.isVar()) {
      ASS_NEQ(da.first.var(),da.second.var());
      return da.first.var()<da.second.var();
    }
    else {
      ASS_NEQ(da.first.term()->functor(),da.second.term()->functor());
      return da.first.term()->functor()<da.second.term()->functor();
    }
    return a<b; //if nothing else applies, we keep the original order
  }